

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O2

void __thiscall
editions_unittest::TestDelimited_LengthPrefixed::Clear(TestDelimited_LengthPrefixed *this)

{
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x3) !=
      (undefined1  [16])0x0) {
    *(undefined8 *)((long)&this->field_0 + 8) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestDelimited_LengthPrefixed::Clear() {
// @@protoc_insertion_point(message_clear_start:editions_unittest.TestDelimited.LengthPrefixed)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    ::memset(&_impl_.a_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b_) -
        reinterpret_cast<char*>(&_impl_.a_)) + sizeof(_impl_.b_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}